

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

String * __thiscall
kj::anon_unknown_123::LocalPeerIdentityImpl::toString
          (String *__return_storage_ptr__,LocalPeerIdentityImpl *this)

{
  uint *in_R8;
  char (*in_R9) [2];
  uint *u;
  ArrayPtr<char> buffer;
  ArrayPtr<char> buffer_00;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  char uidBuffer [16];
  char pidBuffer [16];
  
  pidBuffer[0] = '\0';
  pidBuffer[1] = '\0';
  pidBuffer[2] = '\0';
  pidBuffer[3] = '\0';
  pidBuffer[4] = '\0';
  pidBuffer[5] = '\0';
  pidBuffer[6] = '\0';
  pidBuffer[7] = '\0';
  pidBuffer[8] = '\0';
  pidBuffer[9] = '\0';
  pidBuffer[10] = '\0';
  pidBuffer[0xb] = '\0';
  pidBuffer[0xc] = '\0';
  pidBuffer[0xd] = '\0';
  pidBuffer[0xe] = '\0';
  pidBuffer[0xf] = '\0';
  local_48.size_ = 1;
  local_48.ptr = "";
  if ((this->creds).pid.ptr.isSet == true) {
    buffer.size_ = (size_t)" pid:";
    buffer.ptr = (char *)0x10;
    local_48 = (ArrayPtr<const_char>)
               strPreallocated<char_const(&)[6],int&>
                         ((kj *)pidBuffer,buffer,(char (*) [6])&(this->creds).pid.ptr.field_1,
                          (int *)in_R8);
  }
  uidBuffer[0] = '\0';
  uidBuffer[1] = '\0';
  uidBuffer[2] = '\0';
  uidBuffer[3] = '\0';
  uidBuffer[4] = '\0';
  uidBuffer[5] = '\0';
  uidBuffer[6] = '\0';
  uidBuffer[7] = '\0';
  uidBuffer[8] = '\0';
  uidBuffer[9] = '\0';
  uidBuffer[10] = '\0';
  uidBuffer[0xb] = '\0';
  uidBuffer[0xc] = '\0';
  uidBuffer[0xd] = '\0';
  uidBuffer[0xe] = '\0';
  uidBuffer[0xf] = '\0';
  local_58.size_ = 1;
  local_58.ptr = "";
  if ((this->creds).uid.ptr.isSet == true) {
    buffer_00.size_ = (size_t)" uid:";
    buffer_00.ptr = (char *)0x10;
    local_58 = (ArrayPtr<const_char>)
               strPreallocated<char_const(&)[6],unsigned_int&>
                         ((kj *)uidBuffer,buffer_00,(char (*) [6])&(this->creds).uid.ptr.field_1,
                          in_R8);
  }
  str<char_const(&)[12],kj::StringPtr&,kj::StringPtr&,char_const(&)[2]>
            (__return_storage_ptr__,(kj *)"(local peer",(char (*) [12])&local_48,
             (StringPtr *)&local_58,(StringPtr *)0x41cdcf,in_R9);
  return __return_storage_ptr__;
}

Assistant:

kj::String toString() override {
    char pidBuffer[16]{};
    kj::StringPtr pidStr = nullptr;
    KJ_IF_SOME(p, creds.pid) {
      pidStr = strPreallocated(pidBuffer, " pid:", p);
    }

    char uidBuffer[16]{};
    kj::StringPtr uidStr = nullptr;
    KJ_IF_SOME(u, creds.uid) {
      uidStr = strPreallocated(uidBuffer, " uid:", u);
    }

    return kj::str("(local peer", pidStr, uidStr, ")");
  }